

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_integer_abi_cxx11_
          (result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  source_ptr *psVar2;
  pointer ppVar3;
  _func_int **pp_Var4;
  char cVar5;
  const_iterator f;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  value_type *pvVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  const_iterator in_RCX;
  region *this_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  string str;
  result<toml::detail::region,_toml::detail::none_t> token;
  integer retval;
  istringstream iss;
  allocator_type local_369;
  string local_368;
  undefined1 local_348 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_330;
  undefined1 local_328 [32];
  undefined1 local_308 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [2];
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [8];
  undefined1 local_260 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  string local_1f8;
  _func_int **local_1d8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_1a0 [8];
  undefined1 local_198 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  ios_base local_128 [264];
  
  f._M_current = *(char **)(this + 0x40);
  if ((f._M_current != *(char **)(*(long *)(this + 8) + 8)) && (*f._M_current == '0')) {
    in_RCX._M_current = f._M_current + 1;
    if (in_RCX._M_current == *(char **)(*(long *)(this + 8) + 8)) {
      *(ulong *)(this + 0x18) = *(long *)(this + 0x18) + (ulong)(*f._M_current == '\n');
      *(char **)(this + 0x40) = in_RCX._M_current;
      region::region((region *)local_308,(location *)this,(const_iterator)f._M_current,in_RCX);
      uVar8 = local_308._32_8_;
      uVar7 = local_308._16_8_;
      uVar6 = local_308._8_8_;
      local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
      local_260._0_8_ = &PTR__region_001a7798;
      local_308._8_8_ = (_func_int **)0x0;
      local_308._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._24_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0) {
        local_238._8_8_ = local_2e0[0]._8_8_;
        local_260._24_8_ = &local_238;
      }
      else {
        local_260._24_8_ = local_308._24_8_;
      }
      local_238._M_allocated_capacity._1_7_ = local_2e0[0]._M_allocated_capacity._1_7_;
      local_238._M_local_buf[0] = local_2e0[0]._M_local_buf[0];
      uVar9 = local_238._M_allocated_capacity;
      local_308._32_8_ = (pointer)0x0;
      local_2e0[0]._M_local_buf[0] = '\0';
      local_228._M_allocated_capacity = local_2e0[1]._0_8_;
      local_228._8_8_ = local_2e0[1]._8_8_;
      local_1a0._0_4_ = 0;
      local_198._0_8_ = &PTR__region_001a7798;
      local_260._8_8_ = (pointer)0x0;
      local_260._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._24_8_ == &local_238) {
        local_170._8_8_ = local_238._8_8_;
        local_198._24_8_ = &local_170;
      }
      else {
        local_198._24_8_ = local_260._24_8_;
      }
      local_260._32_8_ = 0;
      local_238._M_allocated_capacity = (ulong)(uint7)local_2e0[0]._1_7_ << 8;
      local_160._M_allocated_capacity = local_2e0[1]._0_8_;
      local_160._8_8_ = local_2e0[1]._8_8_;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value.first = 0;
      (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_001a7798;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)uVar6;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_198._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      local_198._8_8_ = (pointer)0x0;
      paVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._24_8_ == &local_170) {
        paVar1->_M_allocated_capacity = uVar9;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
             local_170._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
             (pointer)local_198._24_8_;
        (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2.
        _M_allocated_capacity = uVar9;
      }
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = uVar8;
      local_198._32_8_ = 0;
      local_170._M_allocated_capacity = (ulong)(uint7)local_2e0[0]._1_7_ << 8;
      (__return_storage_ptr__->field_1).succ.value.second.first_._M_current =
           (char *)local_2e0[1]._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.last_._M_current =
           (char *)local_2e0[1]._8_8_;
      local_308._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0;
      local_260._24_8_ = &local_238;
      local_198._24_8_ = &local_170;
      region::~region((region *)local_198);
      region::~region((region *)local_260);
      this_00 = (region *)local_308;
      goto LAB_00130929;
    }
    cVar5 = *in_RCX._M_current;
    if (cVar5 == 'x') {
      parse_hexadecimal_integer_abi_cxx11_(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if (cVar5 == 'o') {
      parse_octal_integer_abi_cxx11_(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if (cVar5 == 'b') {
      parse_binary_integer_abi_cxx11_(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if ((int)cVar5 - 0x30U < 10) {
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_368,
                 "toml::parse_integer: leading zero in an Integer is not allowed.","");
      source_location::source_location((source_location *)local_268,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[13],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a0,(source_location *)local_268,(char (*) [13])0x174b90);
      __l._M_len = 1;
      __l._M_array = (iterator)local_1a0;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_348,__l,(allocator_type *)&local_1f8);
      local_328._0_8_ = (pointer)0x0;
      local_328._8_8_ = (pointer)0x0;
      local_328._16_8_ = (pointer)0x0;
      format_underline((string *)local_2b8,&local_368,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_348,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_328,false);
      goto LAB_00130565;
    }
    iVar10 = isalpha((int)cVar5);
    if (iVar10 != 0) {
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_368,"toml::parse_integer: unknown integer prefix appeared.","");
      source_location::source_location((source_location *)local_268,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[19],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a0,(source_location *)local_268,(char (*) [19])"none of 0x, 0o, 0b");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_1a0;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_348,__l_00,(allocator_type *)&local_1f8);
      local_328._0_8_ = (pointer)0x0;
      local_328._8_8_ = (pointer)0x0;
      local_328._16_8_ = (pointer)0x0;
      format_underline((string *)local_2b8,&local_368,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_348,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_328,false);
      goto LAB_00130565;
    }
  }
  sequence<toml::detail::maybe<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>_>,_toml::detail::either<toml::detail::sequence<toml::detail::in_range<'1',_'9'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::sequence<toml::detail::character<'_'>,_toml::detail::in_range<'0',_'9'>_>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::in_range<'0',_'9'>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_308,(location *)this);
  if (local_308[0] != true) {
    location::reset((location *)this,f);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"toml::parse_integer: ","")
    ;
    source_location::source_location((source_location *)local_268,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[33],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1a0,(source_location *)local_268,
               (char (*) [33])"the next token is not an integer");
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_1a0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_348,__l_02,(allocator_type *)&local_1f8);
    local_328._0_8_ = (pointer)0x0;
    local_328._8_8_ = (pointer)0x0;
    local_328._16_8_ = (pointer)0x0;
    format_underline((string *)local_2b8,&local_368,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_348,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_328,false);
LAB_00130565:
    local_308._16_8_ = local_2b0._8_8_;
    pp_Var4 = (_func_int **)(local_308 + 0x10);
    if (local_2b8 == (undefined1  [8])(local_2b0 + 8)) {
      local_308._24_8_ = local_2b0._16_8_;
      local_308._0_8_ = pp_Var4;
    }
    else {
      local_308._0_8_ = local_2b8;
    }
    local_2b0._8_8_ = local_2b0._8_8_ & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    psVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
    (__return_storage_ptr__->field_1).succ.value.first = (long)psVar2;
    if ((_func_int **)local_308._0_8_ == pp_Var4) {
      (psVar2->
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)local_308._16_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._24_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first = local_308._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_308._16_8_;
    }
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)local_2b0._0_8_;
    local_308._16_8_ = local_308._16_8_ & 0xffffffffffffff00;
    local_2b0._0_8_ = 0;
    local_308._8_8_ = (_func_int **)0x0;
    local_308._0_8_ = pp_Var4;
    local_2b8 = (undefined1  [8])(local_2b0 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_p != &local_140) {
      operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_1a0);
    source_location::~source_location((source_location *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  pvVar11 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_308);
  make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            (&local_368,(detail *)(pvVar11->first_)._M_current,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (pvVar11->last_)._M_current,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             in_RCX._M_current);
  local_1a0[0] = 0x5f;
  _Var12 = std::
           __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_368._M_dataplus._M_p,
                      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(local_368._M_dataplus._M_p + local_368._M_string_length),
                      (_Iter_equals_val<const_char>)local_1a0);
  local_368._M_string_length = (long)_Var12._M_current - (long)local_368._M_dataplus._M_p;
  *_Var12._M_current = '\0';
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a0,(string *)&local_368,_S_in);
  local_1d8 = (_func_int **)0x0;
  std::istream::_M_extract<long>((long *)local_1a0);
  if ((local_198[*(long *)(CONCAT44(local_1a0._4_4_,local_1a0._0_4_) + -0x18) + 0x18] & 5) == 0) {
    pvVar11 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                        ((result<toml::detail::region,_toml::detail::none_t> *)local_308);
    local_2b8 = (undefined1  [8])local_1d8;
    region::region((region *)(local_2b8 + 8),pvVar11);
    uVar8 = local_2b0._32_8_;
    uVar7 = local_2b0._16_8_;
    uVar6 = local_2b0._8_8_;
    local_268 = local_2b8;
    local_260._0_8_ = &PTR__region_001a7798;
    local_2b0._8_8_ = (element_type *)0x0;
    local_2b0._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._24_8_ == &local_288) {
      local_238._8_8_ = local_288._8_8_;
      local_260._24_8_ = &local_238;
    }
    else {
      local_260._24_8_ = local_2b0._24_8_;
    }
    local_238._M_allocated_capacity._1_7_ = local_288._M_allocated_capacity._1_7_;
    local_238._M_local_buf[0] = local_288._M_local_buf[0];
    local_2b0._32_8_ = 0;
    local_288._M_local_buf[0] = '\0';
    local_228._M_allocated_capacity = local_278._M_allocated_capacity;
    local_228._8_8_ = local_278._8_8_;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.first = (long)local_2b8;
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)&PTR__region_001a7798;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar6;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_260._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
    local_260._8_8_ = (pointer)0x0;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
         (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._24_8_ == &local_238) {
      paVar1->_M_allocated_capacity = local_238._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
           local_238._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)local_260._24_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2._M_allocated_capacity
           = local_238._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = uVar8;
    local_260._32_8_ = 0;
    local_238._M_allocated_capacity = (ulong)(uint7)local_288._M_allocated_capacity._1_7_ << 8;
    (__return_storage_ptr__->field_1).succ.value.second.first_._M_current =
         (char *)local_278._M_allocated_capacity;
    (__return_storage_ptr__->field_1).succ.value.second.last_._M_current = (char *)local_278._8_8_;
    local_2b0._24_8_ = &local_288;
    local_260._24_8_ = &local_238;
    region::~region((region *)local_260);
    region::~region((region *)(local_2b8 + 8));
  }
  else {
    location::reset((location *)this,f);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"toml::parse_integer:","");
    source_location::source_location((source_location *)local_2b8,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[13],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_268,(source_location *)local_2b8,(char (*) [13])"out of range");
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_268;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_1d0,__l_01,&local_369);
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline((string *)local_328,&local_1f8,&local_1d0,&local_1b8,false);
    local_348._16_8_ = local_328._16_8_;
    ppVar3 = (pointer)(local_348 + 0x10);
    if ((pointer)local_328._0_8_ == (pointer)(local_328 + 0x10)) {
      p_Stack_330 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._24_8_;
      local_348._0_8_ = ppVar3;
    }
    else {
      local_348._0_8_ = local_328._0_8_;
    }
    local_328._16_8_ = local_328._16_8_ & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    psVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
    (__return_storage_ptr__->field_1).succ.value.first = (long)psVar2;
    if ((pointer)local_348._0_8_ == ppVar3) {
      (psVar2->
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)local_348._16_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Stack_330;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first = local_348._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_348._16_8_;
    }
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)local_328._8_8_;
    local_348._16_8_ = local_348._16_8_ & 0xffffffffffffff00;
    local_328._8_8_ = (pointer)0x0;
    local_348._8_8_ = (pointer)0x0;
    local_348._0_8_ = ppVar3;
    local_328._0_8_ = (pointer)(local_328 + 0x10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_p != &local_208) {
      operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_268);
    source_location::~source_location((source_location *)local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
  std::ios_base::~ios_base(local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (local_308[0] != true) {
    return __return_storage_ptr__;
  }
  this_00 = (region *)(local_308 + 8);
LAB_00130929:
  region::~region(this_00);
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<integer, region>, std::string>
parse_integer(location& loc)
{
    const auto first = loc.iter();
    if(first != loc.end() && *first == '0')
    {
        const auto second = std::next(first);
        if(second == loc.end()) // the token is just zero.
        {
            loc.advance();
            return ok(std::make_pair(0, region(loc, first, second)));
        }

        if(*second == 'b') {return parse_binary_integer     (loc);} // 0b1100
        if(*second == 'o') {return parse_octal_integer      (loc);} // 0o775
        if(*second == 'x') {return parse_hexadecimal_integer(loc);} // 0xC0FFEE

        if(std::isdigit(*second))
        {
            return err(format_underline("toml::parse_integer: "
                "leading zero in an Integer is not allowed.",
                {{source_location(loc), "leading zero"}}));
        }
        else if(std::isalpha(*second))
        {
             return err(format_underline("toml::parse_integer: "
                "unknown integer prefix appeared.",
                {{source_location(loc), "none of 0x, 0o, 0b"}}));
        }
    }

    if(const auto token = lex_dec_int::invoke(loc))
    {
        auto str = token.unwrap().str();
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

        std::istringstream iss(str);
        integer retval(0);
        iss >> retval;
        if(iss.fail())
        {
            // see parse_octal_integer for detail of this error message.
            loc.reset(first);
            return err(format_underline("toml::parse_integer:",
                       {{source_location(loc), "out of range"}}));
        }
        return ok(std::make_pair(retval, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("toml::parse_integer: ",
               {{source_location(loc), "the next token is not an integer"}}));
}